

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_file_system.cpp
# Opt level: O3

bool __thiscall duckdb::ZstdStreamWrapper::Read(ZstdStreamWrapper *this,StreamData *sd)

{
  uint uVar1;
  size_t code;
  IOException *this_00;
  char *pcVar2;
  ZSTD_inBuffer in_buffer;
  ZSTD_outBuffer out_buffer;
  allocator local_69;
  ZSTD_inBuffer local_68;
  ZSTD_outBuffer local_50;
  string local_38 [32];
  
  local_68.src = sd->in_buff_start;
  local_68.size = (long)sd->in_buff_end - (long)local_68.src;
  local_68.pos = 0;
  local_50.dst = sd->out_buff_start;
  local_50.size = sd->out_buf_size;
  local_50.pos = 0;
  code = duckdb_zstd::ZSTD_decompressStream(this->zstd_stream_ptr,&local_50,&local_68);
  uVar1 = duckdb_zstd::ZSTD_isError(code);
  if (uVar1 == 0) {
    sd->in_buff_start = (data_ptr_t)((long)local_68.src + local_68.pos);
    sd->in_buff_end = (data_ptr_t)((long)local_68.src + local_68.size);
    sd->out_buff_end = (data_ptr_t)((long)local_50.dst + local_50.pos);
    return false;
  }
  this_00 = (IOException *)__cxa_allocate_exception(0x10);
  pcVar2 = duckdb_zstd::ZSTD_getErrorName(code);
  std::__cxx11::string::string(local_38,pcVar2,&local_69);
  duckdb::IOException::IOException(this_00,local_38);
  __cxa_throw(this_00,&IOException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool ZstdStreamWrapper::Read(StreamData &sd) {
	D_ASSERT(!writing);

	duckdb_zstd::ZSTD_inBuffer in_buffer;
	duckdb_zstd::ZSTD_outBuffer out_buffer;

	in_buffer.src = sd.in_buff_start;
	in_buffer.size = sd.in_buff_end - sd.in_buff_start;
	in_buffer.pos = 0;

	out_buffer.dst = sd.out_buff_start;
	out_buffer.size = sd.out_buf_size;
	out_buffer.pos = 0;

	auto res = duckdb_zstd::ZSTD_decompressStream(zstd_stream_ptr, &out_buffer, &in_buffer);
	if (duckdb_zstd::ZSTD_isError(res)) {
		throw IOException(duckdb_zstd::ZSTD_getErrorName(res));
	}

	sd.in_buff_start = (data_ptr_t)in_buffer.src + in_buffer.pos;  // NOLINT
	sd.in_buff_end = (data_ptr_t)in_buffer.src + in_buffer.size;   // NOLINT
	sd.out_buff_end = (data_ptr_t)out_buffer.dst + out_buffer.pos; // NOLINT
	return false;
}